

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionFileFormat.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> *
RegionFileFormat::readChunk
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,ChunkHeader *header,
          int headerIndex,path *param_3,istream *regionFile)

{
  allocator_type local_1d;
  uint32_t chunkSize;
  
  std::istream::seekg((long)regionFile,(int)header[headerIndex] << 8);
  std::istream::read((char *)regionFile,(long)&chunkSize);
  chunkSize = (chunkSize >> 0x18 | (chunkSize & 0xff0000) >> 8 | (chunkSize & 0xff00) << 8 |
              chunkSize << 0x18) - 4;
  std::vector<char,_std::allocator<char>_>::vector
            (__return_storage_ptr__,(ulong)chunkSize,&local_1d);
  std::istream::read((char *)regionFile,
                     (long)(__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)
                           ._M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> RegionFileFormat::readChunk(ChunkHeader header[], int headerIndex, const fs::path& /*filename*/, std::istream& regionFile) {
    regionFile.seekg(header[headerIndex].offset * SECTOR_SIZE, std::ios::beg);
    uint32_t chunkSize;
    regionFile.read(reinterpret_cast<char*>(&chunkSize), sizeof(chunkSize));
    chunkSize = byteswap(chunkSize) - sizeof(chunkSize);
    std::vector<char> chunkData(chunkSize);
    regionFile.read(chunkData.data(), chunkSize);
    return chunkData;
}